

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O0

ReadOnlyUnicodeString __thiscall Strings::convert(Strings *this,FastString *string)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  CharPointer pCVar4;
  uchar *puVar5;
  CharPointer extraout_RDX;
  CharPointer extraout_RDX_00;
  CharPointer pCVar6;
  ReadOnlyUnicodeString RVar7;
  uint local_60;
  int iStack_5c;
  uint8 extra;
  int n;
  int charCount;
  uint32 bitCountMask;
  uint32 dataMask;
  uint8 c;
  int i;
  uint8 *buffer;
  CharType *dest;
  CharType *data;
  FastString *string_local;
  ReadOnlyUnicodeString *ret;
  
  iVar3 = Bstrlib::String::getLength(string);
  ReadOnlyUnicodeString::ReadOnlyUnicodeString
            ((ReadOnlyUnicodeString *)this,(CharPointer)0x0,iVar3 + 1);
  pCVar4 = ReadOnlyUnicodeString::getData((ReadOnlyUnicodeString *)this);
  pCVar6 = extraout_RDX;
  if (pCVar4 != (CharPointer)0x0) {
    puVar5 = Bstrlib::String::operator_cast_to_unsigned_char_(string);
    dataMask = 0;
    buffer = (uint8 *)pCVar4;
    while (iVar3 = Bstrlib::String::getLength(string), (int)dataMask < iVar3) {
      bVar1 = puVar5[(int)dataMask];
      if ((bVar1 & 0x80) == 0) {
        *(uint *)buffer = (uint)bVar1;
        dataMask = dataMask + 1;
      }
      else {
        charCount = 0x7f;
        iStack_5c = 0;
        for (n = 0x40; ((uint)bVar1 & n) != 0 && n != 0; n = (uint)n >> 1) {
          iStack_5c = iStack_5c + 1;
          charCount = (uint)charCount >> 1;
        }
        local_60 = (uint)bVar1 & charCount;
        dataMask = dataMask + 1;
        while( true ) {
          iStack_5c = iStack_5c + -1;
          bVar2 = false;
          if (-1 < iStack_5c) {
            iVar3 = Bstrlib::String::getLength(string);
            bVar2 = (int)dataMask < iVar3;
          }
          if ((!bVar2) || ((puVar5[(int)dataMask] & 0xc0) != 0x80)) break;
          local_60 = puVar5[(int)dataMask] & 0x3f | local_60 << 6;
          dataMask = dataMask + 1;
        }
        *(uint *)buffer = local_60;
      }
      buffer = buffer + 4;
    }
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    ReadOnlyUnicodeString::limitTo
              ((ReadOnlyUnicodeString *)this,(int)((ulong)((long)buffer - (long)pCVar4) >> 2));
    pCVar6 = extraout_RDX_00;
  }
  RVar7.data = pCVar6;
  RVar7._0_8_ = this;
  return RVar7;
}

Assistant:

ReadOnlyUnicodeString convert(const FastString & string)
    {
        // Create some space for the UCS-2 string
        ReadOnlyUnicodeString ret(0, string.getLength() + 1);
        ReadOnlyUnicodeString::CharType * data = const_cast<ReadOnlyUnicodeString::CharType *>(ret.getData());
        if (!data) return ret;

        ReadOnlyUnicodeString::CharType * dest = data;

        // Direct access to the buffer (don't bound check for every access)
        const uint8 * buffer = (const uint8*)string;
        for (int i = 0; i < string.getLength();)
        {
            // Get the current char
            const uint8 c = buffer [i++];

            // Check for UTF8 code
            if ((c & 0x80) != 0)
            {
                // The data is in the 7 low bits
                uint32 dataMask = 0x7f;
                // The count bit mask
                uint32 bitCountMask = 0x40;
                // The consumption count
                int charCount = 0;

                while ((c & bitCountMask) != 0 && bitCountMask)
                {
                    ++charCount;
                    dataMask >>= 1; bitCountMask >>= 1;
                }

                // Get the few bits remaining here
                int n = (c & dataMask);

                // Then extract the remaining bits
                while (--charCount >= 0 && i < string.getLength())
                {
                    const uint8 extra = buffer[i];
                    // Make sure it's a valid UTF8 encoding
                    if ((extra & 0xc0) != 0x80) break;

                    // Store the new bits too
                    n <<= 6; n |= (extra & 0x3f);
                    ++i;
                }

                *dest++ = (ReadOnlyUnicodeString::CharType)n;
            }
            else // Append the char as-is
                *dest++ = (ReadOnlyUnicodeString::CharType)c;
        }

        // Store the last zero byte
        *dest = 0;
        // Create the returned object
        ret.limitTo((int)(dest - data));
        return ret;
    }